

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

value * mjs::get_this_arg(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                         value *this_arg)

{
  long *plVar1;
  gc_heap_ptr_untyped gStack_28;
  
  if (this_arg->type_ < boolean) {
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&gStack_28,&global->super_gc_heap_ptr_untyped);
    value::value(__return_storage_ptr__,(object_ptr *)&gStack_28);
  }
  else {
    plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 0x88))(&gStack_28,plVar1,this_arg);
    value::value(__return_storage_ptr__,(object_ptr *)&gStack_28);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&gStack_28);
  return __return_storage_ptr__;
}

Assistant:

value get_this_arg(const gc_heap_ptr<global_object>& global, const value& this_arg) {
    if (this_arg.type() == value_type::undefined || this_arg.type() == value_type::null) {
        return value{global};
    } else {
        return value{global->to_object(this_arg)};
    }
}